

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_vector.c
# Opt level: O3

exr_result_t exr_attr_string_vector_destroy(exr_context_t ctxt,exr_attr_string_vector_t *sv)

{
  exr_attr_string_t *peVar1;
  int iVar2;
  exr_result_t eVar3;
  long lVar4;
  char **ppcVar5;
  _internal_exr_context *pctxt;
  
  if (ctxt == (exr_context_t)0x0) {
    eVar3 = 2;
  }
  else {
    eVar3 = 0;
    if (sv != (exr_attr_string_vector_t *)0x0) {
      if (0 < sv->alloc_size) {
        peVar1 = sv->strings;
        iVar2 = sv->n_strings;
        if (0 < iVar2) {
          ppcVar5 = &peVar1->str;
          lVar4 = 0;
          do {
            if (peVar1 != (exr_attr_string_t *)0x0) {
              if ((*ppcVar5 != (char *)0x0) && (0 < *(int32_t *)((long)ppcVar5 + -4))) {
                (**(code **)(ctxt + 0x60))();
              }
              ((exr_attr_string_t *)(ppcVar5 + -1))->length = 0;
              ((exr_attr_string_t *)(ppcVar5 + -1))->alloc_size = 0;
              *ppcVar5 = (char *)0x0;
              iVar2 = sv->n_strings;
            }
            lVar4 = lVar4 + 1;
            ppcVar5 = ppcVar5 + 2;
          } while (lVar4 < iVar2);
        }
        if (peVar1 != (exr_attr_string_t *)0x0) {
          (**(code **)(ctxt + 0x60))(peVar1);
        }
      }
      sv->n_strings = 0;
      sv->alloc_size = 0;
      sv->strings = (exr_attr_string_t *)0x0;
      eVar3 = 0;
    }
  }
  return eVar3;
}

Assistant:

exr_result_t
exr_attr_string_vector_destroy (
    exr_context_t ctxt, exr_attr_string_vector_t* sv)
{
    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (sv)
    {
        exr_attr_string_vector_t nil = {0};
        if (sv->alloc_size > 0)
        {
            exr_attr_string_t* strs =
                EXR_CONST_CAST (exr_attr_string_t*, sv->strings);
            for (int32_t i = 0; i < sv->n_strings; ++i)
                exr_attr_string_destroy (ctxt, strs + i);
            if (strs) pctxt->free_fn (strs);
        }
        *sv = nil;
    }
    return EXR_ERR_SUCCESS;
}